

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O2

Layer * ncnn::Input_layer_creator(void)

{
  Input *this;
  
  this = (Input *)operator_new(200);
  Input::Input(this);
  return &this->super_Layer;
}

Assistant:

Input::Input()
{
    one_blob_only = true;
    support_inplace = true;
    support_vulkan = true;
    support_packing = true;
    support_bf16_storage = true;
    support_image_storage = true;
}